

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  size_t bits;
  AccelData *pAVar8;
  ulong uVar9;
  uint i;
  long lVar10;
  NodeRef *pNVar11;
  undefined4 uVar12;
  RTCFilterFunctionN p_Var13;
  NodeRef nodeRef;
  RTCFilterFunctionN p_Var14;
  RTCFilterFunctionN p_Var15;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar16;
  RTCFilterFunctionN p_Var17;
  Primitive *prim;
  bool bVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  undefined1 auVar20 [64];
  vint4 ai_2;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  float fVar29;
  float fVar34;
  float fVar35;
  vint4 ai;
  undefined1 auVar30 [16];
  float fVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  vint4 ai_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_3;
  undefined1 auVar40 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi;
  undefined1 auVar41 [16];
  vint4 bi_1;
  undefined1 auVar42 [16];
  vint4 bi_3;
  undefined1 auVar43 [16];
  vint4 bi_2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar48;
  float fVar49;
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1728;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  pAVar8 = This->ptr;
  p_Var17 = *(RTCFilterFunctionN *)&pAVar8[1].bounds.bounds0.lower.field_0;
  if (p_Var17 != (RTCFilterFunctionN)0x8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pAVar8 = (AccelData *)context->args,
       ((ulong)(pAVar8->super_RefCount)._vptr_RefCount & 0x10000) != 0)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar47 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar22 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar47);
    iVar7 = vmovmskps_avx(auVar22);
    uVar9 = CONCAT44((int)((ulong)pAVar8 >> 0x20),iVar7);
    if (iVar7 != 0) {
      auVar31 = *(undefined1 (*) [16])(ray + 0x40);
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar31,auVar21);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar23,auVar37,1);
      auVar24 = vblendvps_avx(auVar31,auVar37,auVar23);
      auVar23 = *(undefined1 (*) [16])(ray + 0x50);
      auVar45 = vandps_avx(auVar23,auVar21);
      auVar45 = vcmpps_avx(auVar45,auVar37,1);
      auVar25 = vblendvps_avx(auVar23,auVar37,auVar45);
      auVar45 = *(undefined1 (*) [16])(ray + 0x60);
      auVar21 = vandps_avx(auVar45,auVar21);
      auVar21 = vcmpps_avx(auVar21,auVar37,1);
      auVar21 = vblendvps_avx(auVar45,auVar37,auVar21);
      auVar37 = vrcpps_avx(auVar24);
      fVar46 = auVar37._0_4_;
      auVar30._0_4_ = auVar24._0_4_ * fVar46;
      fVar48 = auVar37._4_4_;
      auVar30._4_4_ = auVar24._4_4_ * fVar48;
      fVar49 = auVar37._8_4_;
      auVar30._8_4_ = auVar24._8_4_ * fVar49;
      fVar50 = auVar37._12_4_;
      auVar30._12_4_ = auVar24._12_4_ * fVar50;
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar51,auVar30);
      auVar24 = vrcpps_avx(auVar25);
      fVar29 = auVar24._0_4_;
      auVar38._0_4_ = auVar25._0_4_ * fVar29;
      fVar34 = auVar24._4_4_;
      auVar38._4_4_ = auVar25._4_4_ * fVar34;
      fVar35 = auVar24._8_4_;
      auVar38._8_4_ = auVar25._8_4_ * fVar35;
      fVar36 = auVar24._12_4_;
      auVar38._12_4_ = auVar25._12_4_ * fVar36;
      auVar25 = vsubps_avx(auVar51,auVar38);
      auVar24 = vrcpps_avx(auVar21);
      fVar3 = auVar24._0_4_;
      auVar44._0_4_ = auVar21._0_4_ * fVar3;
      fVar4 = auVar24._4_4_;
      auVar44._4_4_ = auVar21._4_4_ * fVar4;
      fVar5 = auVar24._8_4_;
      auVar44._8_4_ = auVar21._8_4_ * fVar5;
      fVar6 = auVar24._12_4_;
      auVar44._12_4_ = auVar21._12_4_ * fVar6;
      auVar21 = vsubps_avx(auVar51,auVar44);
      auVar24 = ZEXT416(0) << 0x20;
      auVar31 = vcmpps_avx(auVar31,auVar24,1);
      auVar52._8_4_ = 1;
      auVar52._0_8_ = 0x100000001;
      auVar52._12_4_ = 1;
      auVar31 = vandps_avx(auVar52,auVar31);
      auVar23 = vcmpps_avx(auVar23,auVar24,1);
      auVar53._8_4_ = 2;
      auVar53._0_8_ = 0x200000002;
      auVar53._12_4_ = 2;
      auVar23 = vandps_avx(auVar53,auVar23);
      auVar23 = vorps_avx(auVar23,auVar31);
      auVar54 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar31 = vcmpps_avx(auVar45,auVar24,1);
      auVar45._8_4_ = 4;
      auVar45._0_8_ = 0x400000004;
      auVar45._12_4_ = 4;
      auVar31 = vandps_avx(auVar45,auVar31);
      auVar57 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar58 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar47 = vpor_avx(auVar22 ^ auVar47,auVar31);
      local_1758 = vpor_avx(auVar47,auVar23);
      do {
        lVar10 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar12 = *(undefined4 *)(local_1758 + lVar10 * 4);
        auVar47._4_4_ = uVar12;
        auVar47._0_4_ = uVar12;
        auVar47._8_4_ = uVar12;
        auVar47._12_4_ = uVar12;
        auVar47 = vpcmpeqd_avx(auVar47,local_1758);
        uVar12 = vmovmskps_avx(auVar47);
        uVar9 = uVar9 & ~CONCAT44((int)((ulong)lVar10 >> 0x20),uVar12);
      } while (uVar9 != 0);
      local_1758 = vpcmpeqd_avx(auVar47,auVar47);
      auVar22 = vpcmpeqd_avx(local_1758,(undefined1  [16])valid_i->field_0);
      auVar47 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar55 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_near[1].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar47,auVar22);
      auVar56 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = (size_t)p_Var17;
      if (p_Var17 != (RTCFilterFunctionN)&DAT_fffffffffffffff8) {
        fVar46 = fVar46 + auVar37._0_4_ * fVar46;
        fVar48 = fVar48 + auVar37._4_4_ * fVar48;
        fVar49 = fVar49 + auVar37._8_4_ * fVar49;
        fVar50 = fVar50 + auVar37._12_4_ * fVar50;
        fVar29 = fVar29 + auVar25._0_4_ * fVar29;
        fVar34 = fVar34 + auVar25._4_4_ * fVar34;
        fVar35 = fVar35 + auVar25._8_4_ * fVar35;
        fVar36 = fVar36 + auVar25._12_4_ * fVar36;
        local_16e8 = fVar3 + auVar21._0_4_ * fVar3;
        fStack_16e4 = fVar4 + auVar21._4_4_ * fVar4;
        fStack_16e0 = fVar5 + auVar21._8_4_ * fVar5;
        fStack_16dc = fVar6 + auVar21._12_4_ * fVar6;
        pNVar11 = stack_node + 1;
        auVar47 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        auVar31._8_4_ = 0xff800000;
        auVar31._0_8_ = 0xff800000ff800000;
        auVar31._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar31,auVar47,auVar22);
        paVar16 = &stack_near[2].field_0;
        local_16f8 = *(undefined1 (*) [16])ray;
        local_1708 = *(undefined1 (*) [16])(ray + 0x10);
        local_1718 = *(undefined1 (*) [16])(ray + 0x20);
        local_1728 = stack_near[1].field_0;
        local_1738 = fVar46;
        fStack_1734 = fVar48;
        fStack_1730 = fVar49;
        fStack_172c = fVar50;
        local_1748 = fVar29;
        fStack_1744 = fVar34;
        fStack_1740 = fVar35;
        fStack_173c = fVar36;
        do {
          paVar1 = paVar16 + -1;
          auVar20 = ZEXT1664((undefined1  [16])*paVar1);
          paVar16 = paVar16 + -1;
          auVar47 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
          if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar47[0xf] < '\0') {
            while (((ulong)p_Var17 & 8) == 0) {
              lVar10 = 0;
              uVar9 = 0;
              auVar20 = ZEXT1664(auVar55._0_16_);
              p_Var14 = (RTCFilterFunctionN)0x8;
              do {
                p_Var15 = *(RTCFilterFunctionN *)
                           (((ulong)p_Var17 & 0xfffffffffffffff0) + lVar10 * 8);
                if (p_Var15 == (RTCFilterFunctionN)0x8) break;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x20);
                auVar22._4_4_ = uVar12;
                auVar22._0_4_ = uVar12;
                auVar22._8_4_ = uVar12;
                auVar22._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar22,auVar54._0_16_);
                auVar32._0_4_ = fVar46 * auVar47._0_4_;
                auVar32._4_4_ = fVar48 * auVar47._4_4_;
                auVar32._8_4_ = fVar49 * auVar47._8_4_;
                auVar32._12_4_ = fVar50 * auVar47._12_4_;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x40);
                auVar23._4_4_ = uVar12;
                auVar23._0_4_ = uVar12;
                auVar23._8_4_ = uVar12;
                auVar23._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar23,auVar57._0_16_);
                auVar39._0_4_ = fVar29 * auVar47._0_4_;
                auVar39._4_4_ = fVar34 * auVar47._4_4_;
                auVar39._8_4_ = fVar35 * auVar47._8_4_;
                auVar39._12_4_ = fVar36 * auVar47._12_4_;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x60);
                auVar24._4_4_ = uVar12;
                auVar24._0_4_ = uVar12;
                auVar24._8_4_ = uVar12;
                auVar24._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar24,auVar58._0_16_);
                auVar40._0_4_ = local_16e8 * auVar47._0_4_;
                auVar40._4_4_ = fStack_16e4 * auVar47._4_4_;
                auVar40._8_4_ = fStack_16e0 * auVar47._8_4_;
                auVar40._12_4_ = fStack_16dc * auVar47._12_4_;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x30);
                auVar25._4_4_ = uVar12;
                auVar25._0_4_ = uVar12;
                auVar25._8_4_ = uVar12;
                auVar25._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar25,auVar54._0_16_);
                auVar41._0_4_ = fVar46 * auVar47._0_4_;
                auVar41._4_4_ = fVar48 * auVar47._4_4_;
                auVar41._8_4_ = fVar49 * auVar47._8_4_;
                auVar41._12_4_ = fVar50 * auVar47._12_4_;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x50);
                auVar26._4_4_ = uVar12;
                auVar26._0_4_ = uVar12;
                auVar26._8_4_ = uVar12;
                auVar26._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar26,auVar57._0_16_);
                auVar42._0_4_ = fVar29 * auVar47._0_4_;
                auVar42._4_4_ = fVar34 * auVar47._4_4_;
                auVar42._8_4_ = fVar35 * auVar47._8_4_;
                auVar42._12_4_ = fVar36 * auVar47._12_4_;
                uVar12 = *(undefined4 *)(p_Var17 + lVar10 * 4 + 0x70);
                auVar27._4_4_ = uVar12;
                auVar27._0_4_ = uVar12;
                auVar27._8_4_ = uVar12;
                auVar27._12_4_ = uVar12;
                auVar47 = vsubps_avx(auVar27,auVar58._0_16_);
                auVar43._0_4_ = local_16e8 * auVar47._0_4_;
                auVar43._4_4_ = fStack_16e4 * auVar47._4_4_;
                auVar43._8_4_ = fStack_16e0 * auVar47._8_4_;
                auVar43._12_4_ = fStack_16dc * auVar47._12_4_;
                auVar47 = vpminsd_avx(auVar32,auVar41);
                auVar22 = vpminsd_avx(auVar39,auVar42);
                auVar47 = vpmaxsd_avx(auVar47,auVar22);
                auVar22 = vpminsd_avx(auVar40,auVar43);
                auVar22 = vpmaxsd_avx(auVar47,auVar22);
                auVar47 = vpmaxsd_avx(auVar32,auVar41);
                auVar31 = vpmaxsd_avx(auVar39,auVar42);
                auVar23 = vpminsd_avx(auVar47,auVar31);
                auVar47 = vpmaxsd_avx(auVar40,auVar43);
                auVar31 = vpmaxsd_avx(auVar22,auVar56._0_16_);
                auVar47 = vpminsd_avx(auVar47,(undefined1  [16])bi_8.field_0);
                auVar47 = vpminsd_avx(auVar23,auVar47);
                auVar47 = vcmpps_avx(auVar31,auVar47,2);
                if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar47[0xf] < '\0') {
                  aVar33 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar55._0_16_,auVar22,auVar47);
                  aVar19 = auVar20._0_16_;
                  auVar47 = vcmpps_avx((undefined1  [16])aVar33,(undefined1  [16])aVar19,1);
                  p_Var13 = p_Var15;
                  aVar28 = aVar33;
                  if (((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar47[0xf]) ||
                     (bVar18 = p_Var14 != (RTCFilterFunctionN)0x8, p_Var13 = p_Var14,
                     p_Var14 = p_Var15, aVar28 = aVar19, aVar19 = aVar33, bVar18)) {
                    aVar33 = aVar19;
                    uVar9 = uVar9 + 1;
                    pNVar11->ptr = (size_t)p_Var13;
                    pNVar11 = pNVar11 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar16->v = aVar28;
                    paVar16 = paVar16 + 1;
                    p_Var15 = p_Var14;
                  }
                  auVar20 = ZEXT1664((undefined1  [16])aVar33);
                  p_Var14 = p_Var15;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              if (p_Var14 == (RTCFilterFunctionN)0x8) goto LAB_00307543;
              p_Var17 = p_Var14;
              if (1 < uVar9) {
                aVar33 = paVar16[-2];
                aVar28 = paVar16[-1];
                auVar47 = vcmpps_avx((undefined1  [16])aVar33,(undefined1  [16])aVar28,1);
                aVar19 = aVar28;
                if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar47[0xf] < '\0') {
                  paVar16[-2] = aVar28;
                  paVar16[-1] = aVar33;
                  auVar47 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar11 + -2) = auVar47;
                  aVar19 = aVar33;
                  aVar33 = aVar28;
                }
                if (uVar9 != 2) {
                  aVar28 = paVar16[-3];
                  auVar47 = vcmpps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar19,1);
                  if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar47[0xf] < '\0') {
                    paVar16[-3] = aVar19;
                    paVar16[-1] = aVar28;
                    sVar2 = pNVar11[-3].ptr;
                    pNVar11[-3].ptr = pNVar11[-1].ptr;
                    pNVar11[-1].ptr = sVar2;
                    aVar28 = aVar19;
                  }
                  auVar47 = vcmpps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar33,1);
                  if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar47[0xf] < '\0') {
                    paVar16[-3] = aVar33;
                    paVar16[-2] = aVar28;
                    auVar47 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar11 + -3) = auVar47;
                  }
                }
              }
            }
            if (p_Var17 == (RTCFilterFunctionN)&DAT_fffffffffffffff8) {
              return;
            }
            valid_leaf.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vcmpps_avx((undefined1  [16])bi_8.field_0,auVar20._0_16_,6);
            if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0 ||
                 ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                 (undefined1  [16])0x0) ||
                ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
              lVar10 = (ulong)((uint)p_Var17 & 0xf) - 8;
              if (lVar10 != 0) {
                prim = (Primitive *)((ulong)p_Var17 & 0xfffffffffffffff0);
                do {
                  InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                  prim = prim + 1;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
                auVar54 = ZEXT1664(local_16f8);
                auVar57 = ZEXT1664(local_1708);
                auVar58 = ZEXT1664(local_1718);
                auVar55 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar56 = ZEXT1664((undefined1  [16])local_1728);
                fVar29 = local_1748;
                fVar34 = fStack_1744;
                fVar35 = fStack_1740;
                fVar36 = fStack_173c;
                fVar46 = local_1738;
                fVar48 = fStack_1734;
                fVar49 = fStack_1730;
                fVar50 = fStack_172c;
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             vblendvps_avx((undefined1  [16])bi_8.field_0,
                                           *(undefined1 (*) [16])(ray + 0x80),
                                           (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_00307543:
          p_Var17 = (RTCFilterFunctionN)pNVar11[-1].ptr;
          pNVar11 = pNVar11 + -1;
        } while (p_Var17 != (RTCFilterFunctionN)&DAT_fffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }